

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeBuffer.cpp
# Opt level: O3

void __thiscall cali::NodeBuffer::append(NodeBuffer *this,NodeInfo *info)

{
  cali_id_t cVar1;
  bool bVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  void *__src;
  ulong uVar7;
  byte *pbVar8;
  byte bVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  uchar *puVar13;
  uchar *puVar14;
  
  sVar6 = this->m_pos;
  sVar4 = cali_variant_get_size((info->value).m_v);
  reserve(this,sVar6 + sVar4 + 0x32);
  puVar14 = this->m_buffer + this->m_pos;
  cVar1 = info->parent_id;
  uVar12 = (ulong)(cVar1 != 0xffffffffffffffff) + info->node_id * 2;
  lVar5 = 1;
  if (info->node_id * 2 < 0x80) {
    lVar10 = 1;
    puVar13 = puVar14;
  }
  else {
    lVar10 = 0;
    uVar7 = uVar12;
    do {
      lVar11 = lVar10;
      puVar14[lVar11] = (byte)uVar7 | 0x80;
      uVar12 = uVar7 >> 7;
      bVar2 = 0x3fff < uVar7;
      lVar10 = lVar11 + 1;
      uVar7 = uVar12;
    } while (bVar2);
    lVar10 = lVar11 + 2;
    puVar13 = puVar14 + lVar11 + 1;
  }
  *puVar13 = (uchar)uVar12;
  uVar12 = info->attr_id;
  puVar13 = puVar14 + lVar10;
  if (0x7f < uVar12) {
    lVar11 = 0;
    uVar7 = uVar12;
    do {
      lVar5 = lVar11;
      puVar13[lVar5] = (byte)uVar7 | 0x80;
      uVar12 = uVar7 >> 7;
      bVar2 = 0x3fff < uVar7;
      lVar11 = lVar5 + 1;
      uVar7 = uVar12;
    } while (bVar2);
    puVar13 = puVar13 + lVar5 + 1;
    lVar5 = lVar5 + 2;
  }
  lVar5 = lVar5 + lVar10;
  *puVar13 = (uchar)uVar12;
  if (cVar1 != 0xffffffffffffffff) {
    uVar12 = info->parent_id;
    puVar13 = puVar14 + lVar5;
    lVar10 = 1;
    if (0x7f < uVar12) {
      uVar7 = uVar12;
      lVar11 = 0;
      do {
        lVar10 = lVar11;
        puVar13[lVar10] = (byte)uVar7 | 0x80;
        uVar12 = uVar7 >> 7;
        bVar2 = 0x3fff < uVar7;
        uVar7 = uVar12;
        lVar11 = lVar10 + 1;
      } while (bVar2);
      puVar13 = puVar13 + lVar10 + 1;
      lVar10 = lVar10 + 2;
    }
    *puVar13 = (uchar)uVar12;
    lVar5 = lVar5 + lVar10;
  }
  bVar9 = (byte)(info->value).m_v.type_and_size;
  pbVar8 = puVar14 + lVar5;
  lVar10 = 1;
  if (bVar9 < 0x80) {
    lVar11 = 1;
  }
  else {
    *pbVar8 = bVar9 | 0x80;
    pbVar8 = pbVar8 + 1;
    lVar11 = 2;
    bVar9 = 1;
  }
  *pbVar8 = bVar9;
  sVar6 = cali_variant_get_size((info->value).m_v);
  puVar13 = puVar14 + lVar11 + lVar5;
  if (0x7f < sVar6) {
    sVar4 = sVar6;
    lVar3 = 0;
    do {
      lVar10 = lVar3;
      puVar13[lVar10] = (byte)sVar4 | 0x80;
      sVar6 = sVar4 >> 7;
      bVar2 = 0x3fff < sVar4;
      sVar4 = sVar6;
      lVar3 = lVar10 + 1;
    } while (bVar2);
    puVar13 = puVar13 + lVar10 + 1;
    lVar10 = lVar10 + 2;
  }
  *puVar13 = (uchar)sVar6;
  lVar10 = lVar10 + lVar11 + lVar5;
  __src = cali_variant_get_data(&(info->value).m_v);
  sVar6 = cali_variant_get_size((info->value).m_v);
  memcpy(puVar14 + lVar10,__src,sVar6);
  sVar6 = cali_variant_get_size((info->value).m_v);
  this->m_count = this->m_count + 1;
  this->m_pos = sVar6 + lVar10 + this->m_pos;
  return;
}

Assistant:

void NodeBuffer::append(const NodeInfo& info)
{
    reserve(m_pos + max_packed_size(info));

    m_pos += ::pack_node(m_buffer + m_pos, info);
    ++m_count;
}